

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::InferredValueFunction::checkArguments
          (InferredValueFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *this_00;
  bool bVar1;
  Diagnostic *this_01;
  Type *pTVar2;
  
  this_00 = ((context->scope).ptr)->compilation;
  bVar1 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,0,0);
  if (bVar1) {
    if (((context->flags).m_bits & 0x2000000000) != 0) {
      if (this->isClockFunc != true) {
        return this_00->logicType;
      }
      pTVar2 = Compilation::getType(this_00,EventType);
      return pTVar2;
    }
    this_01 = ASTContext::addDiag(context,(DiagCode)0x1a000b,range);
    Diagnostic::operator<<(this_01,&(this->super_SystemSubroutine).name);
  }
  return this_00->errorType;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 0, 0))
            return comp.getErrorType();

        if (!context.flags.has(ASTFlags::AssertionDefaultArg)) {
            context.addDiag(diag::InferredValDefArg, range) << name;
            return comp.getErrorType();
        }

        return isClockFunc ? comp.getType(SyntaxKind::EventType) : comp.getLogicType();
    }